

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_Wrapper *test_value)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  Am_Wrapper *pAVar4;
  
  uVar1 = this->type;
  if ((uVar1 & 0x7000) == 0x2000) {
    pAVar4 = (this->value).wrapper_value;
    if (pAVar4 == test_value) {
      return false;
    }
    if (pAVar4 == (Am_Wrapper *)0x0 || test_value == (Am_Wrapper *)0x0) {
      return true;
    }
  }
  else {
    uVar3 = (uint)uVar1;
    if ((uVar1 < 10) && ((0x20cU >> (uVar3 & 0x1f) & 1) != 0)) {
      return test_value != (Am_Wrapper *)0x0 || (this->value).wrapper_value != (Am_Wrapper *)0x0;
    }
    if ((uVar3 != 0x8008) && (uVar3 != 0x8006)) {
      return true;
    }
    pAVar4 = (this->value).wrapper_value;
    if (pAVar4 == test_value) {
      return false;
    }
    if (pAVar4 == (Am_Wrapper *)0x0 || test_value == (Am_Wrapper *)0x0) {
      return true;
    }
  }
  iVar2 = (*(pAVar4->super_Am_Registered_Type)._vptr_Am_Registered_Type[6])();
  return (bool)((byte)iVar2 ^ 1);
}

Assistant:

bool
Am_Value::operator!=(Am_Wrapper *test_value) const
{
  if (Am_Type_Class(type) == Am_WRAPPER)
    return (value.wrapper_value != test_value) &&
           (!test_value || !value.wrapper_value ||
            !(*value.wrapper_value == *test_value));
  switch (type) {
  case Am_STRING:
  case Am_DOUBLE:
    return (value.wrapper_value != test_value) &&
           (!test_value || !value.wrapper_value ||
            !(*value.wrapper_value == *test_value));
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    if (!value.voidptr_value)
      return test_value != nullptr;
  default:
    return true;
  }
}